

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O2

Value * duckdb::Value::MinimumValue(Value *__return_storage_ptr__,LogicalType *type)

{
  PhysicalType PVar1;
  undefined1 auVar2 [16];
  byte width;
  uint8_t width_00;
  date_t dVar3;
  timestamp_t tVar4;
  timestamp_ms_t timestamp;
  timestamp_tz_t value;
  timestamp_sec_t timestamp_00;
  InvalidTypeException *this;
  InternalException *this_00;
  string_t *value_00;
  uint8_t in_R9B;
  hugeint_t hVar5;
  hugeint_t value_01;
  hugeint_t value_02;
  LogicalType LStack_88;
  Value local_70;
  
  switch(type->id_) {
  case SQLNULL:
  case INTEGER:
    INTEGER(__return_storage_ptr__,-0x80000000);
    break;
  case UNKNOWN:
  case ANY:
  case USER:
  case USER|SQLNULL:
  case USER|UNKNOWN:
  case USER|ANY:
  case 8:
  case 9:
  case CHAR:
  case VARCHAR:
  case BLOB:
  case INTERVAL:
  case TIMESTAMP_TZ|SQLNULL:
  case TIME_TZ|SQLNULL:
  case BIT:
  case STRING_LITERAL:
  case INTEGER_LITERAL:
  case 0x28:
  case 0x29:
  case TIMESTAMP_TZ|BOOLEAN:
  case TIMESTAMP_TZ|TINYINT:
  case TIMESTAMP_TZ|SMALLINT:
  case TIMESTAMP_TZ|INTEGER:
  case TIMESTAMP_TZ|BIGINT:
  case TIMESTAMP_TZ|DATE:
  case TIMESTAMP_TZ|TIME:
  case POINTER:
  case TIMESTAMP_TZ|TIMESTAMP_NS:
  case VALIDITY:
switchD_012b0195_caseD_2:
    this = (InvalidTypeException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_70,"MinimumValue requires numeric type",(allocator *)&LStack_88);
    InvalidTypeException::InvalidTypeException(this,type,(string *)&local_70);
    __cxa_throw(this,&InvalidTypeException::typeinfo,::std::runtime_error::~runtime_error);
  case BOOLEAN:
    BOOLEAN(__return_storage_ptr__,false);
    break;
  case TINYINT:
    TINYINT(__return_storage_ptr__,-0x80);
    break;
  case SMALLINT:
    SMALLINT(__return_storage_ptr__,-0x8000);
    break;
  case BIGINT:
    BIGINT(__return_storage_ptr__,-0x8000000000000000);
    break;
  case DATE:
    dVar3 = Date::FromDate(-0x59af89,6,0x19);
    DATE(__return_storage_ptr__,dVar3);
    break;
  case TIME:
    TIME(__return_storage_ptr__,(dtime_t)0x0);
    break;
  case TIMESTAMP_SEC:
    LogicalType::LogicalType(&LStack_88,TIMESTAMP);
    MinimumValue(&local_70,&LStack_88);
    tVar4 = GetValueInternal<duckdb::timestamp_t>(&local_70);
    ~Value(&local_70);
    LogicalType::~LogicalType(&LStack_88);
    timestamp_00 = Cast::Operation<duckdb::timestamp_t,duckdb::timestamp_sec_t>(tVar4);
    TIMESTAMPSEC(__return_storage_ptr__,timestamp_00);
    break;
  case TIMESTAMP_MS:
    LogicalType::LogicalType(&LStack_88,TIMESTAMP);
    MinimumValue(&local_70,&LStack_88);
    tVar4 = GetValueInternal<duckdb::timestamp_t>(&local_70);
    ~Value(&local_70);
    LogicalType::~LogicalType(&LStack_88);
    timestamp = Cast::Operation<duckdb::timestamp_t,duckdb::timestamp_ms_t>(tVar4);
    TIMESTAMPMS(__return_storage_ptr__,timestamp);
    break;
  case TIMESTAMP:
    dVar3 = Date::FromDate(-0x46e04,0xc,0x16);
    TIMESTAMP(__return_storage_ptr__,dVar3,(dtime_t)0x0);
    break;
  case TIMESTAMP_NS:
    TIMESTAMPNS(__return_storage_ptr__,(timestamp_ns_t)0x80004de2e24f0000);
    break;
  case DECIMAL:
    width = DecimalType::GetWidth(type);
    width_00 = DecimalType::GetScale(type);
    PVar1 = type->physical_type_;
    if (PVar1 == INT128) {
      hVar5 = hugeint_t::operator-((hugeint_t *)(Hugeint::POWERS_OF_TEN + (ulong)width * 0x10));
      hugeint_t::hugeint_t((hugeint_t *)&local_70,1);
      auVar2._8_8_ = local_70.type_.type_info_.internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      auVar2[0] = local_70.type_.id_;
      auVar2[1] = local_70.type_.physical_type_;
      auVar2._2_6_ = local_70.type_._2_6_;
      value_02.upper._0_1_ = width;
      value_02.lower = SUB168((undefined1  [16])hVar5 + auVar2,8);
      value_02.upper._1_7_ = 0;
      DECIMAL(__return_storage_ptr__,SUB168((undefined1  [16])hVar5 + auVar2,0),value_02,width_00,
              in_R9B);
    }
    else if (PVar1 == INT32) {
      DECIMAL(__return_storage_ptr__,1 - *(int *)(NumericHelper::POWERS_OF_TEN + (ulong)width * 8),
              width,width_00);
    }
    else if (PVar1 == INT64) {
      DECIMAL(__return_storage_ptr__,1 - *(long *)(NumericHelper::POWERS_OF_TEN + (ulong)width * 8),
              width,width_00);
    }
    else {
      if (PVar1 != INT16) {
        this_00 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_70,"Unknown decimal type",(allocator *)&LStack_88);
        InternalException::InternalException(this_00,(string *)&local_70);
        __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      DECIMAL(__return_storage_ptr__,1 - *(short *)(NumericHelper::POWERS_OF_TEN + (ulong)width * 8)
              ,width,width_00);
    }
    break;
  case FLOAT:
    FLOAT(__return_storage_ptr__,-3.4028235e+38);
    break;
  case DOUBLE:
    DOUBLE(__return_storage_ptr__,-1.79769313486232e+308);
    break;
  case UTINYINT:
    UTINYINT(__return_storage_ptr__,'\0');
    break;
  case USMALLINT:
    USMALLINT(__return_storage_ptr__,0);
    break;
  case UINTEGER:
    UINTEGER(__return_storage_ptr__,0);
    break;
  case UBIGINT:
    UBIGINT(__return_storage_ptr__,0);
    break;
  case TIMESTAMP_TZ:
    dVar3 = Date::FromDate(-0x46e04,0xc,0x16);
    value.super_timestamp_t.value = Timestamp::FromDatetime(dVar3,(dtime_t)0x0);
    TIMESTAMPTZ(__return_storage_ptr__,value);
    break;
  case TIME_TZ:
    TIMETZ(__return_storage_ptr__,(dtime_tz_t)0x0);
    break;
  case VARINT:
    string_t::string_t((string_t *)&LStack_88,
                       "-179769313486231570814527423731704356798070567525844996598917476803157260780028538760589558632766878171540458953514382464234321326889464182768467546703537516986049910576551282076245490090389328944075868508455133942304583236903222948165808559332123348274797826204144723168738177180919299881250404026184124858368"
                      );
    Varint::VarcharToVarInt_abi_cxx11_((string *)&local_70,(Varint *)&LStack_88,value_00);
    VARINT(__return_storage_ptr__,(string *)&local_70);
    ::std::__cxx11::string::~string((string *)&local_70);
    break;
  case UHUGEINT:
    UHUGEINT(__return_storage_ptr__,(Value *)0x0,(uhugeint_t)(ZEXT816(0x1fd8384) << 0x40));
    break;
  case HUGEINT:
    value_01.upper = (int64_t)&switchD_012b0195::switchdataD_01fd8384;
    value_01.lower = 0x8000000000000000;
    HUGEINT(__return_storage_ptr__,(Value *)0x0,value_01);
    break;
  case UUID:
    hVar5.upper = (int64_t)&switchD_012b0195::switchdataD_01fd8384;
    hVar5.lower = 0x8000000000000000;
    UUID(__return_storage_ptr__,(Value *)0x0,hVar5);
    break;
  default:
    if (type->id_ != ENUM) goto switchD_012b0195_caseD_2;
    ENUM(__return_storage_ptr__,0,type);
  }
  return __return_storage_ptr__;
}

Assistant:

Value Value::MinimumValue(const LogicalType &type) {
	switch (type.id()) {
	case LogicalTypeId::BOOLEAN:
		return Value::BOOLEAN(false);
	case LogicalTypeId::TINYINT:
		return Value::TINYINT(NumericLimits<int8_t>::Minimum());
	case LogicalTypeId::SMALLINT:
		return Value::SMALLINT(NumericLimits<int16_t>::Minimum());
	case LogicalTypeId::INTEGER:
	case LogicalTypeId::SQLNULL:
		return Value::INTEGER(NumericLimits<int32_t>::Minimum());
	case LogicalTypeId::BIGINT:
		return Value::BIGINT(NumericLimits<int64_t>::Minimum());
	case LogicalTypeId::HUGEINT:
		return Value::HUGEINT(NumericLimits<hugeint_t>::Minimum());
	case LogicalTypeId::UHUGEINT:
		return Value::UHUGEINT(NumericLimits<uhugeint_t>::Minimum());
	case LogicalTypeId::UUID:
		return Value::UUID(NumericLimits<hugeint_t>::Minimum());
	case LogicalTypeId::UTINYINT:
		return Value::UTINYINT(NumericLimits<uint8_t>::Minimum());
	case LogicalTypeId::USMALLINT:
		return Value::USMALLINT(NumericLimits<uint16_t>::Minimum());
	case LogicalTypeId::UINTEGER:
		return Value::UINTEGER(NumericLimits<uint32_t>::Minimum());
	case LogicalTypeId::UBIGINT:
		return Value::UBIGINT(NumericLimits<uint64_t>::Minimum());
	case LogicalTypeId::DATE:
		return Value::DATE(Date::FromDate(Date::DATE_MIN_YEAR, Date::DATE_MIN_MONTH, Date::DATE_MIN_DAY));
	case LogicalTypeId::TIME:
		return Value::TIME(dtime_t(0));
	case LogicalTypeId::TIMESTAMP: {
		const auto date = Date::FromDate(Timestamp::MIN_YEAR, Timestamp::MIN_MONTH, Timestamp::MIN_DAY);
		return Value::TIMESTAMP(date, dtime_t(0));
	}
	case LogicalTypeId::TIMESTAMP_SEC: {
		// Get the minimum timestamp and cast it to timestamp_sec_t.
		const auto min_ts = MinimumValue(LogicalType::TIMESTAMP).GetValue<timestamp_t>();
		const auto ts = Cast::Operation<timestamp_t, timestamp_sec_t>(min_ts);
		return Value::TIMESTAMPSEC(ts);
	}
	case LogicalTypeId::TIMESTAMP_MS: {
		// Get the minimum timestamp and cast it to timestamp_ms_t.
		const auto min_ts = MinimumValue(LogicalType::TIMESTAMP).GetValue<timestamp_t>();
		const auto ts = Cast::Operation<timestamp_t, timestamp_ms_t>(min_ts);
		return Value::TIMESTAMPMS(ts);
	}
	case LogicalTypeId::TIMESTAMP_NS: {
		// Clear the fractional day.
		auto min_ns = NumericLimits<int64_t>::Minimum();
		min_ns /= Interval::NANOS_PER_DAY;
		min_ns *= Interval::NANOS_PER_DAY;
		return Value::TIMESTAMPNS(timestamp_ns_t(min_ns));
	}
	case LogicalTypeId::TIME_TZ:
		//	"00:00:00+1559" from the PG docs, but actually 00:00:00+15:59:59
		return Value::TIMETZ(dtime_tz_t(dtime_t(0), dtime_tz_t::MAX_OFFSET));
	case LogicalTypeId::TIMESTAMP_TZ: {
		const auto date = Date::FromDate(Timestamp::MIN_YEAR, Timestamp::MIN_MONTH, Timestamp::MIN_DAY);
		const auto ts = Timestamp::FromDatetime(date, dtime_t(0));
		return Value::TIMESTAMPTZ(timestamp_tz_t(ts));
	}
	case LogicalTypeId::FLOAT:
		return Value::FLOAT(NumericLimits<float>::Minimum());
	case LogicalTypeId::DOUBLE:
		return Value::DOUBLE(NumericLimits<double>::Minimum());
	case LogicalTypeId::DECIMAL: {
		auto width = DecimalType::GetWidth(type);
		auto scale = DecimalType::GetScale(type);
		switch (type.InternalType()) {
		case PhysicalType::INT16:
			return Value::DECIMAL(int16_t(-NumericHelper::POWERS_OF_TEN[width] + 1), width, scale);
		case PhysicalType::INT32:
			return Value::DECIMAL(int32_t(-NumericHelper::POWERS_OF_TEN[width] + 1), width, scale);
		case PhysicalType::INT64:
			return Value::DECIMAL(int64_t(-NumericHelper::POWERS_OF_TEN[width] + 1), width, scale);
		case PhysicalType::INT128:
			return Value::DECIMAL(-Hugeint::POWERS_OF_TEN[width] + 1, width, scale);
		default:
			throw InternalException("Unknown decimal type");
		}
	}
	case LogicalTypeId::ENUM:
		return Value::ENUM(0, type);
	case LogicalTypeId::VARINT:
		return Value::VARINT(Varint::VarcharToVarInt(
		    "-179769313486231570814527423731704356798070567525844996598917476803157260780028538760589558632766878171540"
		    "4589535143824642343213268894641827684675467035375169860499105765512820762454900903893289440758685084551339"
		    "42304583236903222948165808559332123348274797826204144723168738177180919299881250404026184124858368"));
	default:
		throw InvalidTypeException(type, "MinimumValue requires numeric type");
	}
}